

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

int message_get_application_properties(MESSAGE_HANDLE message,AMQP_VALUE *application_properties)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  int iVar3;
  
  if (message == (MESSAGE_HANDLE)0x0 || application_properties == (AMQP_VALUE *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x373;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_get_application_properties",0x372,1,
                "Bad arguments: message = %p, application_properties = %p",message,
                application_properties);
    }
  }
  else if (message->application_properties == (AMQP_VALUE)0x0) {
    *application_properties = (AMQP_VALUE)0x0;
    iVar3 = 0;
  }
  else {
    pAVar2 = amqpvalue_clone(message->application_properties);
    *application_properties = pAVar2;
    iVar3 = 0;
    if (pAVar2 == (AMQP_VALUE)0x0) {
      p_Var1 = xlogging_get_log_function();
      iVar3 = 0x388;
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_get_application_properties",0x387,1,
                  "Cannot clone application properties");
      }
    }
  }
  return iVar3;
}

Assistant:

int message_get_application_properties(MESSAGE_HANDLE message, AMQP_VALUE* application_properties)
{
    int result;

    if ((message == NULL) ||
        (application_properties == NULL))
    {
        /* Codes_SRS_MESSAGE_01_072: [ If `message` or `application_properties` is NULL, `message_get_application_properties` shall fail and return a non-zero value. ]*/
        LogError("Bad arguments: message = %p, application_properties = %p",
            message, application_properties);
        result = MU_FAILURE;
    }
    else
    {
        if (message->application_properties == NULL)
        {
            /* Codes_SRS_MESSAGE_01_150: [ If no application properties have been set, `message_get_application_properties` shall set `application_properties` to NULL. ]*/
            *application_properties = NULL;

            /* Codes_SRS_MESSAGE_01_071: [ On success, `message_get_application_properties` shall return 0. ]*/
            result = 0;
        }
        else
        {
            /* Codes_SRS_MESSAGE_01_070: [ `message_get_application_properties` shall copy the contents of application message properties for the message instance identified by `message` into the argument `application_properties`. ]*/
            /* Codes_SRS_MESSAGE_01_073: [ Cloning the application properties shall be done by calling `application_properties_clone`. ]*/
            *application_properties = application_properties_clone(message->application_properties);
            if (*application_properties == NULL)
            {
                /* Codes_SRS_MESSAGE_01_074: [ If `application_properties_clone` fails, `message_get_application_properties` shall fail and return a non-zero value. ]*/
                LogError("Cannot clone application properties");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_MESSAGE_01_071: [ On success, `message_get_application_properties` shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}